

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O3

void Gia_ManCountCareBits(Gia_Man_t *p,Vec_Wec_t *vPats)

{
  ulong *puVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  undefined8 uVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  Vec_Int_t *pVVar9;
  Vec_Int_t *pVVar10;
  uint uVar11;
  ulong *puVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  
  uVar8 = vPats->nSize;
  uVar14 = (ulong)(int)uVar8;
  if ((long)uVar14 < 1) {
    iVar16 = p->nObjs;
    uVar6 = 0;
  }
  else {
    lVar20 = 0;
    uVar6 = 0;
    do {
      pVVar10 = vPats->pArray;
      if (pVVar10[lVar20].nSize != p->vCis->nSize) {
        __assert_fail("Vec_IntSize(vPat) == Gia_ManCiNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                      ,0x364,"void Gia_ManCountCareBits(Gia_Man_t *, Vec_Wec_t *)");
      }
      *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xffffffffbfffffff;
      *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xbfffffffffffffff;
      pVVar9 = p->vCis;
      if (0 < pVVar9->nSize) {
        lVar15 = 0;
        do {
          iVar16 = pVVar9->pArray[lVar15];
          if (((long)iVar16 < 0) || (p->nObjs <= iVar16)) goto LAB_005879fc;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          if (pVVar10[lVar20].nSize <= lVar15) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          pGVar2 = p->pObjs + iVar16;
          *(ulong *)pGVar2 =
               *(ulong *)pGVar2 & 0xbfffffffbfffffff |
               (ulong)((pVVar10[lVar20].pArray[lVar15] & 1U) << 0x1e);
          lVar15 = lVar15 + 1;
          pVVar9 = p->vCis;
        } while (lVar15 < pVVar9->nSize);
      }
      uVar14 = (ulong)(uint)p->nObjs;
      if (0 < p->nObjs) {
        lVar15 = 0;
        lVar18 = 0;
        do {
          pGVar2 = p->pObjs;
          if (pGVar2 == (Gia_Obj_t *)0x0) break;
          uVar7 = *(ulong *)(&pGVar2->field_0x0 + lVar15);
          if ((uVar7 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar7) {
            *(ulong *)(&pGVar2->field_0x0 + lVar15) =
                 uVar7 & 0xbfffffff3fffffff |
                 (ulong)((((uint)(uVar7 >> 0x3d) ^
                          *(uint *)((long)pGVar2 +
                                   (ulong)((uint)(uVar7 >> 0x1e) & 0x7ffffffc) * -3 + lVar15) >>
                          0x1e) & ((uint)(uVar7 >> 0x1d) & 7 ^
                                  *(uint *)((long)pGVar2 +
                                           (ulong)(uint)((int)(uVar7 & 0x1fffffff) << 2) * -3 +
                                           lVar15) >> 0x1e) & 1) << 0x1e);
            uVar14 = (ulong)(uint)p->nObjs;
          }
          lVar18 = lVar18 + 1;
          lVar15 = lVar15 + 0xc;
        } while (lVar18 < (int)uVar14);
      }
      pVVar10 = p->vCos;
      if (0 < pVVar10->nSize) {
        lVar15 = 0;
        do {
          iVar16 = pVVar10->pArray[lVar15];
          if (((long)iVar16 < 0) || (uVar14 = (ulong)(uint)p->nObjs, p->nObjs <= iVar16))
          goto LAB_005879fc;
          if (p->pObjs == (Gia_Obj_t *)0x0) goto LAB_00587802;
          pGVar2 = p->pObjs + iVar16;
          uVar8 = (uint)*(ulong *)pGVar2;
          uVar14 = (ulong)(uVar8 & 0x1fffffff);
          *(ulong *)pGVar2 =
               *(ulong *)pGVar2 & 0xffffffffbfffffff |
               (ulong)((uVar8 * 2 ^ *(uint *)(pGVar2 + -uVar14)) & 0x40000000);
          *(ulong *)(pGVar2 + -uVar14) = *(ulong *)(pGVar2 + -uVar14) | 0x4000000000000000;
          lVar15 = lVar15 + 1;
          pVVar10 = p->vCos;
        } while (lVar15 < pVVar10->nSize);
        uVar14 = (ulong)(uint)p->nObjs;
      }
LAB_00587802:
      if (1 < (int)uVar14) {
        uVar7 = uVar14;
        lVar15 = uVar14 * 0xc;
        do {
          lVar18 = lVar15 + -0xc;
          uVar14 = (ulong)p->nObjs;
          if ((long)uVar14 < (long)uVar7) {
LAB_005879fc:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          pGVar2 = p->pObjs;
          if (pGVar2 == (Gia_Obj_t *)0x0) goto LAB_00587924;
          uVar14 = *(ulong *)(&pGVar2[-1].field_0x0 + lVar15);
          if ((uVar14 & 0x4000000080000000) == 0x4000000000000000 &&
              (uVar14 & 0x1fffffff) != 0x1fffffff) {
            uVar8 = (int)(uVar14 & 0x1fffffff) << 2;
            puVar1 = (ulong *)((long)pGVar2 + lVar18 + (ulong)uVar8 * -3);
            uVar3 = *(ulong *)((long)pGVar2 + lVar18 + (ulong)uVar8 * -3);
            if (((uint)uVar14 >> 0x1e & 1) == 0) {
              uVar13 = (uint)(uVar3 >> 0x1e) & 1;
              uVar19 = (uint)(uVar14 >> 0x1d) & 7;
              uVar8 = (uint)(uVar14 >> 0x1e) & 0x7ffffffc;
              uVar17 = *(ulong *)((long)pGVar2 + lVar18 + (ulong)uVar8 * -3);
              uVar11 = (uint)(uVar14 >> 0x3d) ^ (uint)(uVar17 >> 0x1e) & 3;
              if ((uVar13 != uVar19) && ((uVar11 & 1) != 0)) {
                __assert_fail("fCompl0 == 0 || fCompl1 == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                              ,899,"void Gia_ManCountCareBits(Gia_Man_t *, Vec_Wec_t *)");
              }
              puVar12 = (ulong *)((long)pGVar2 + lVar18 + (ulong)uVar8 * -3);
              if (((uVar11 & 1) != 0) && (puVar12 = puVar1, uVar17 = uVar3, uVar13 != uVar19))
              goto LAB_00587907;
            }
            else {
              *puVar1 = uVar3 | 0x4000000000000000;
              puVar12 = (ulong *)((long)pGVar2 +
                                 (ulong)((*(uint *)(&pGVar2[-1].field_0x4 + lVar15) & 0x1fffffff) <<
                                        2) * -3 + lVar18);
              uVar17 = *puVar12;
            }
            *puVar12 = uVar17 | 0x4000000000000000;
          }
LAB_00587907:
          bVar5 = 2 < uVar7;
          uVar7 = uVar7 - 1;
          lVar15 = lVar18;
        } while (bVar5);
        uVar14 = (ulong)(uint)p->nObjs;
      }
LAB_00587924:
      iVar16 = (int)uVar14;
      if (iVar16 < 1) {
        uVar14 = 0;
      }
      else {
        lVar15 = 0;
        uVar8 = 0;
        do {
          if (p->pObjs == (Gia_Obj_t *)0x0) {
            uVar8 = 0;
            break;
          }
          uVar4 = *(undefined8 *)(&p->pObjs->field_0x0 + lVar15);
          uVar13 = (uint)uVar4;
          uVar11 = (uint)((ulong)uVar4 >> 0x3e) & 1;
          if ((~uVar13 & 0x1fffffff) == 0) {
            uVar11 = 0;
          }
          if ((int)uVar13 < 0) {
            uVar11 = 0;
          }
          uVar8 = uVar8 + uVar11;
          lVar15 = lVar15 + 0xc;
        } while ((uVar14 & 0xffffffff) * 0xc != lVar15);
        uVar14 = (ulong)uVar8;
      }
      uVar6 = uVar6 + uVar14;
      lVar20 = lVar20 + 1;
      uVar8 = vPats->nSize;
      uVar14 = (ulong)(int)uVar8;
    } while (lVar20 < (long)uVar14);
  }
  printf("Stats over %d patterns: Average care-nodes = %d (%6.2f %%)\n",
         ((double)(int)(uVar6 / uVar14) * 100.0) /
         (double)(~(p->vCos->nSize + p->vCis->nSize) + iVar16),(ulong)uVar8,
         uVar6 / uVar14 & 0xffffffff);
  return;
}

Assistant:

void Gia_ManCountCareBits( Gia_Man_t * p, Vec_Wec_t * vPats )
{
    Gia_Obj_t * pObj;
    int i, k, fCompl0, fCompl1;
    word Counter = 0;
    Vec_Int_t * vPat;
    Vec_WecForEachLevel( vPats, vPat, i )
    {
        int Count = 0;
        assert( Vec_IntSize(vPat) == Gia_ManCiNum(p) );

        // propagate forward
        Gia_ManConst0(p)->fMark0 = 0;
        Gia_ManConst0(p)->fMark1 = 0;
        Gia_ManForEachCi( p, pObj, k )
        {
            pObj->fMark0 = Vec_IntEntry(vPat, k);
            pObj->fMark1 = 0;
        }
        Gia_ManForEachAnd( p, pObj, k )
        {
            fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
            pObj->fMark0 = fCompl0 & fCompl1;
            pObj->fMark1 = 0;
        }
        Gia_ManForEachCo( p, pObj, k )
        {
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            Gia_ObjFanin0(pObj)->fMark1 = 1;
        }
        // propagate backward
        Gia_ManForEachAndReverse( p, pObj, k )
        {
            if ( !pObj->fMark1 )
                continue;
            if ( pObj->fMark0 == 0 )
            {
                fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
                fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
                assert( fCompl0 == 0 || fCompl1 == 0 );
                if ( fCompl1 == 0 )
                    Gia_ObjFanin1(pObj)->fMark1 = 1;
                else if ( fCompl0 == 0 )
                    Gia_ObjFanin0(pObj)->fMark1 = 1;
                
            }
            else
            {
                Gia_ObjFanin0(pObj)->fMark1 = 1;
                Gia_ObjFanin1(pObj)->fMark1 = 1;
            }
        }
        Gia_ManForEachAnd( p, pObj, k )
            Count += pObj->fMark1;
        Counter += Count;

        //printf( "%3d = %8d\n", i, Count );
    }
    Counter /= Vec_WecSize(vPats);
    printf( "Stats over %d patterns: Average care-nodes = %d (%6.2f %%)\n", Vec_WecSize(vPats), (int)Counter, 100.0*(int)Counter/Gia_ManAndNum(p) );
}